

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object.hpp
# Opt level: O3

Boxed_Value * __thiscall
chaiscript::dispatch::Dynamic_Object::get_attr(Dynamic_Object *this,string *t_attr_name)

{
  const_iterator cVar1;
  range_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_type *local_40;
  size_type local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
          ::find(&(this->m_attrs)._M_t,t_attr_name);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_attrs)._M_t._M_impl.super__Rb_tree_header) {
    return (Boxed_Value *)(cVar1._M_node + 2);
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"Attr not found \'",t_attr_name);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_60,"\' and cannot be added to const obj");
  local_40 = (size_type *)(pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40 == paVar3) {
    local_30 = paVar3->_M_allocated_capacity;
    uStack_28 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_40 = &local_30;
  }
  else {
    local_30 = paVar3->_M_allocated_capacity;
  }
  local_38 = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  std::range_error::range_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

const Boxed_Value &get_attr(const std::string &t_attr_name) const {
        auto a = m_attrs.find(t_attr_name);

        if (a != m_attrs.end()) {
          return a->second;
        } else {
          throw std::range_error("Attr not found '" + t_attr_name + "' and cannot be added to const obj");
        }
      }